

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_parser.cpp
# Opt level: O1

String * dxil_spv::demangle_entry_point(String *__return_storage_ptr__,String *entry)

{
  ulong __n;
  pointer pcVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  size_type __size;
  
  __n = entry->_M_string_length;
  if (__n == 0) {
    uVar4 = 0xffffffffffffffff;
  }
  else {
    pcVar1 = (entry->_M_dataplus)._M_p;
    pvVar2 = memchr(pcVar1,0x3f,__n);
    uVar4 = -(ulong)(pvVar2 == (void *)0x0) | (long)pvVar2 - (long)pcVar1;
  }
  if (uVar4 != 0xffffffffffffffff) {
    uVar4 = uVar4 + 1;
    uVar3 = 0xffffffffffffffff;
    if (uVar4 <= __n && __n - uVar4 != 0) {
      pcVar1 = (entry->_M_dataplus)._M_p;
      pvVar2 = memchr(pcVar1 + uVar4,0x40,__n - uVar4);
      uVar3 = -(ulong)(pvVar2 == (void *)0x0) | (long)pvVar2 - (long)pcVar1;
    }
    if (uVar3 != 0xffffffffffffffff) {
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::substr
                (__return_storage_ptr__,entry,uVar4,uVar3 - uVar4);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (entry->_M_dataplus)._M_p;
  std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
  _M_construct<char*>((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>
                       *)__return_storage_ptr__,pcVar1,pcVar1 + __n);
  return __return_storage_ptr__;
}

Assistant:

String demangle_entry_point(const String &entry)
{
	auto start_idx = entry.find_first_of('?');
	if (start_idx == std::string::npos)
		return entry;

	start_idx++;

	auto end_idx = entry.find_first_of('@', start_idx);
	if (end_idx == std::string::npos)
		return entry;

	return entry.substr(start_idx, end_idx - start_idx);
}